

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.h
# Opt level: O0

void __thiscall
state_machine::variant::
Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B,_VariantMoveTest::C>::Variant
          (Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B,_VariantMoveTest::C> *this,
          Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B,_VariantMoveTest::C> *rhs)

{
  bool bVar1;
  anon_class_8_1_8991fb9c *callable;
  type local_20;
  Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B,_VariantMoveTest::C> *local_18;
  Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B,_VariantMoveTest::C> *rhs_local;
  Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B,_VariantMoveTest::C> *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  memset(this,0,4);
  this->index_ = '\0';
  bVar1 = holds<state_machine::variant::empty,_0>(local_18);
  if (!bVar1) {
    local_20 = (type)this;
    Variant<(anonymous_namespace)::A,(anonymous_namespace)::B,VariantMoveTest::C>::
    on_alternate<state_machine::containers::mapping::bijection<std::pair<(anonymous_namespace)::A,std::integral_constant<unsigned_long,1ul>>,std::pair<(anonymous_namespace)::B,std::integral_constant<unsigned_long,2ul>>,std::pair<VariantMoveTest::C,std::integral_constant<unsigned_long,3ul>>>>
    ::
    invoke<state_machine::variant::Variant<(anonymous_namespace)::A,(anonymous_namespace)::B,VariantMoveTest::C>::invoke(state_machine::variant::Variant<(anonymous_namespace)::A,(anonymous_namespace)::B,VariantMoveTest::C>&&)::_lambda(auto:1&)_1_>
              ((on_alternate<state_machine::containers::mapping::bijection<std::pair<(anonymous_namespace)::A,std::integral_constant<unsigned_long,1ul>>,std::pair<(anonymous_namespace)::B,std::integral_constant<unsigned_long,2ul>>,std::pair<VariantMoveTest::C,std::integral_constant<unsigned_long,3ul>>>>
                *)local_18,&local_20,callable);
  }
  return;
}

Assistant:

Variant(Variant&& rhs) noexcept(
        // NOLINTNEXTLINE(performance-noexcept-move-constructor)
        stdx::conjunction<std::is_nothrow_move_constructible<Ts>...>::value) {
        if (!rhs.holds<empty>()) {
            on_alternate<op::pop_front<op::repack<alternative_index_map, bijection>>>::invoke(
                rhs, [this](auto& s) {
                    using state_type = std::remove_reference_t<decltype(s)>;
                    if (std::is_nothrow_move_constructible<state_type>::value) {
                        this->set<state_type>(std::move(s));
                    }
                });
        }
    }